

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

void xmlRelaxNGPopErrors(xmlRelaxNGValidCtxtPtr ctxt,int level)

{
  xmlRelaxNGValidErrorPtr pxVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = (long)level;
  lVar4 = lVar3 * 0x28 + 0x20;
  for (; lVar3 < ctxt->errNr; lVar3 = lVar3 + 1) {
    pxVar1 = ctxt->errTab;
    if ((*(byte *)((long)pxVar1 + lVar4 + -0x1c) & 1) != 0) {
      pvVar2 = *(void **)((long)pxVar1 + lVar4 + -8);
      if (pvVar2 != (void *)0x0) {
        (*xmlFree)(pvVar2);
      }
      *(undefined8 *)((long)pxVar1 + lVar4 + -8) = 0;
      pvVar2 = *(void **)((long)&pxVar1->err + lVar4);
      if (pvVar2 != (void *)0x0) {
        (*xmlFree)(pvVar2);
      }
      *(undefined8 *)((long)&pxVar1->err + lVar4) = 0;
      *(undefined4 *)((long)pxVar1 + lVar4 + -0x1c) = 0;
    }
    lVar4 = lVar4 + 0x28;
  }
  ctxt->errNr = level;
  if (level < 1) {
    ctxt->err = (xmlRelaxNGValidErrorPtr)0x0;
  }
  return;
}

Assistant:

static void
xmlRelaxNGPopErrors(xmlRelaxNGValidCtxtPtr ctxt, int level)
{
    int i;
    xmlRelaxNGValidErrorPtr err;

#ifdef DEBUG_ERROR
    xmlGenericError(xmlGenericErrorContext,
                    "Pop errors till level %d\n", level);
#endif
    for (i = level; i < ctxt->errNr; i++) {
        err = &ctxt->errTab[i];
        if (err->flags & ERROR_IS_DUP) {
            if (err->arg1 != NULL)
                xmlFree((xmlChar *) err->arg1);
            err->arg1 = NULL;
            if (err->arg2 != NULL)
                xmlFree((xmlChar *) err->arg2);
            err->arg2 = NULL;
            err->flags = 0;
        }
    }
    ctxt->errNr = level;
    if (ctxt->errNr <= 0)
        ctxt->err = NULL;
}